

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

int fasthuf_decode_enabled(void)

{
  return 1;
}

Assistant:

static inline int
fasthuf_decode_enabled ()
{
#if defined(__INTEL_COMPILER) || defined(__GNUC__)

    //
    // Enabled for ICC, GCC:
    //       __i386__   -> x86
    //       __x86_64__ -> 64-bit x86
    //       __e2k__    -> e2k (MCST Elbrus 2000)

#    if defined(__i386__) || defined(__x86_64__) || defined(__e2k__)
    return 1;
#    else
    return 0;
#    endif

#elif defined(_MSC_VER)

    //
    // Enabled for Visual Studio:
    //        _M_IX86 -> x86
    //        _M_X64  -> 64bit x86

#    if defined(_M_IX86) || defined(_M_X64)
    return 1;
#    else
    return 0;
#    endif

#else

    //
    // Unknown compiler - Be safe and disable.
    //
    return 0;
#endif
}